

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,TextureCubeView *src,float *texCoord,ReferenceParams *params)

{
  Vec3 *s;
  Vec3 *s_00;
  Vec3 *w;
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  int iVar5;
  int y;
  int px;
  int iVar6;
  Vec3 *s_01;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Dd;
  float fVar17;
  Vec3 coordDy;
  Vec3 coordDx;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  TextureCubeView src_1;
  TextureCubeView view;
  float local_1e8;
  int local_1d4;
  Vec3 local_1c8;
  float local_1bc;
  undefined1 local_1b8 [16];
  float local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  Sampler *local_198;
  Vec3 local_190;
  Vec3 local_184;
  undefined1 local_178 [16];
  Vec3 local_168;
  float local_15c;
  float local_158;
  float local_154;
  Vec3 local_148;
  float local_13c;
  float local_138;
  float local_134;
  Vec3 local_128;
  float local_11c;
  float local_118;
  float local_114;
  Vec4 *local_108;
  Vec4 *local_100;
  Vec3 local_f8;
  float fStack_ec;
  undefined8 local_e8;
  _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_d8;
  tcu local_c0 [16];
  tcu local_b0 [16];
  undefined1 local_a0 [56];
  TextureCubeView local_68;
  
  getSubView(&local_68,src,params->baseLevel,params->maxLevel);
  fVar8 = *texCoord;
  fVar9 = texCoord[1];
  fVar10 = texCoord[3];
  fVar17 = texCoord[6];
  fVar12 = texCoord[9];
  local_1a8 = texCoord[4];
  local_1b8._0_4_ = texCoord[7];
  fVar11 = texCoord[10];
  fVar13 = texCoord[2];
  fVar1 = texCoord[5];
  fVar2 = texCoord[8];
  fVar3 = texCoord[0xb];
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198 = &params->sampler;
  tcu::getEffectiveTextureView
            ((TextureCubeView *)local_a0,&local_68,
             (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &local_d8,local_198);
  if ((int)local_a0._0_4_ < 1) {
    local_1d4 = 0;
  }
  else {
    local_1d4 = ((IVec3 *)(local_a0._8_8_ + 8))->m_data[0];
  }
  iVar5 = dst->m_width;
  iVar6 = dst->m_height;
  local_128.m_data[0] = fVar8;
  local_128.m_data[1] = fVar10;
  local_128.m_data[2] = fVar17;
  local_11c = fVar12;
  local_118 = fVar17;
  local_114 = fVar10;
  local_148.m_data[0] = fVar9;
  local_148.m_data[1] = local_1a8;
  local_148.m_data[2] = (float)local_1b8._0_4_;
  local_13c = fVar11;
  local_138 = (float)local_1b8._0_4_;
  local_134 = local_1a8;
  local_168.m_data[0] = fVar13;
  local_168.m_data[1] = fVar1;
  local_168.m_data[2] = fVar2;
  local_15c = fVar3;
  local_158 = fVar2;
  local_154 = fVar1;
  local_f8.m_data[0] = (params->super_RenderParams).w.m_data[0];
  local_f8.m_data[1] = (params->super_RenderParams).w.m_data[1];
  local_f8.m_data[2] = (params->super_RenderParams).w.m_data[2];
  fStack_ec = (params->super_RenderParams).w.m_data[3];
  local_e8 = CONCAT44(local_f8.m_data[1],local_f8.m_data[2]);
  local_1e8 = 0.0;
  if (((params->super_RenderParams).flags & 2) != 0) {
    local_1e8 = (params->super_RenderParams).bias;
  }
  fVar8 = (float)iVar5;
  fVar9 = (float)iVar6;
  local_100 = &(params->super_RenderParams).colorScale;
  local_108 = &(params->super_RenderParams).colorBias;
  for (y = 0; y < iVar6; y = y + 1) {
    fVar10 = (float)y + 0.5;
    fVar17 = fVar10 / fVar9;
    uVar14 = 0;
    uVar15 = 0;
    uVar16 = 0;
    local_1bc = 1.0 - fVar17;
    for (iVar6 = 0; iVar6 < iVar5; iVar6 = iVar6 + 1) {
      fVar11 = (float)iVar6 + 0.5;
      local_1a8 = fVar11 / fVar8;
      bVar4 = 1.0 <= fVar17 + local_1a8;
      fVar12 = fVar17;
      if (bVar4) {
        local_1a8 = 1.0 - local_1a8;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        fVar12 = local_1bc;
      }
      s_01 = &local_128 + bVar4;
      s = &local_148 + bVar4;
      s_00 = &local_168 + bVar4;
      fVar13 = s_00->m_data[0];
      local_1c8.m_data[2] =
           ((&local_168)[bVar4].m_data[1] - fVar13) * fVar12 +
           ((&local_168)[bVar4].m_data[2] - fVar13) * local_1a8 + fVar13;
      fVar13 = s->m_data[0];
      fVar1 = s_01->m_data[0];
      local_1b8 = ZEXT416((uint)fVar12);
      local_1c8.m_data[1] =
           fVar12 * ((&local_148)[bVar4].m_data[1] - fVar13) +
           local_1a8 * ((&local_148)[bVar4].m_data[2] - fVar13) + fVar13;
      local_1c8.m_data[0] =
           fVar12 * ((&local_128)[bVar4].m_data[1] - fVar1) +
           local_1a8 * ((&local_128)[bVar4].m_data[2] - fVar1) + fVar1;
      w = &local_f8 + bVar4;
      uStack_1a4 = uVar14;
      uStack_1a0 = uVar15;
      uStack_19c = uVar16;
      fVar12 = triDerivateX(s_01,w,fVar11,fVar8,fVar12);
      fVar13 = triDerivateX(s,w,fVar11,fVar8,(float)local_1b8._0_4_);
      local_184.m_data[2] = triDerivateX(s_00,w,fVar11,fVar8,(float)local_1b8._0_4_);
      local_184.m_data[0] = fVar12;
      local_184.m_data[1] = fVar13;
      fVar12 = triDerivateY(s_01,w,fVar10,fVar9,local_1a8);
      local_1b8._0_4_ = fVar12;
      fVar12 = triDerivateY(s,w,fVar10,fVar9,local_1a8);
      local_190.m_data[2] = triDerivateY(s_00,w,fVar10,fVar9,local_1a8);
      local_190.m_data[0] = (float)local_1b8._0_4_;
      local_190.m_data[1] = fVar12;
      fVar11 = computeCubeLodFromDerivates
                         (params->lodMode,&local_1c8,&local_184,&local_190,local_1d4);
      fVar11 = fVar11 + local_1e8;
      fVar12 = params->maxLod;
      if (fVar11 <= params->maxLod) {
        fVar12 = fVar11;
      }
      uVar7 = -(uint)(fVar11 < params->minLod);
      fVar12 = (float)(uVar7 & (uint)params->minLod | ~uVar7 & (uint)fVar12);
      if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
        local_178._0_4_ =
             tcu::TextureCubeView::sampleCompare
                       ((TextureCubeView *)local_a0,local_198,(params->super_RenderParams).ref,
                        local_1c8.m_data[0],local_1c8.m_data[1],local_1c8.m_data[2],fVar12);
        local_178._4_8_ = 0;
        local_178._12_4_ = 1.0;
      }
      else {
        tcu::TextureCubeView::sample
                  ((TextureCubeView *)local_178,(Sampler *)local_a0,local_1c8.m_data[0],
                   local_1c8.m_data[1],local_1c8.m_data[2],fVar12);
      }
      tcu::operator*(local_c0,(Vector<float,_4> *)local_178,local_100);
      tcu::operator+(local_b0,(Vector<float,_4> *)local_c0,local_108);
      tcu::SurfaceAccess::setPixel(dst,(Vec4 *)local_b0,iVar6,y);
      iVar5 = dst->m_width;
      uVar14 = extraout_XMM0_Db;
      uVar15 = extraout_XMM0_Dc;
      uVar16 = extraout_XMM0_Dd;
    }
    iVar6 = dst->m_height;
  }
  std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  ~_Vector_base(&local_d8);
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::TextureCubeView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::TextureCubeView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4				tq		= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4				rq		= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	return sampleTextureCube(dst, view, sq, tq, rq, params);
}